

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

pair<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry_*,_std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>_>,_bool>
 pdqsort_detail::
 partition_right<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry*,std::vector<HighsGFkSolve::SolutionEntry,std::allocator<HighsGFkSolve::SolutionEntry>>>,std::less<HighsGFkSolve::SolutionEntry>>
           (undefined8 *begin,undefined8 *end)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  pair<__gnu_cxx::__normal_iterator<HighsGFkSolve::SolutionEntry_*,_std::vector<HighsGFkSolve::SolutionEntry,_std::allocator<HighsGFkSolve::SolutionEntry>_>_>,_bool>
  pVar13;
  
  uVar3 = *begin;
  lVar7 = 0;
  do {
    lVar8 = lVar7 + 8;
    lVar5 = lVar7 + 8;
    iVar6 = (int)uVar3;
    lVar7 = lVar8;
  } while (*(int *)((long)begin + lVar5) < iVar6);
  puVar2 = (undefined8 *)((long)begin + lVar8);
  puVar9 = end;
  puVar10 = puVar2;
  if (lVar8 == 8) {
    do {
      puVar9 = end;
      if (end <= puVar2) break;
      puVar9 = end + -1;
      piVar1 = (int *)(end + -1);
      end = puVar9;
    } while (iVar6 <= *piVar1);
  }
  else {
    do {
      end = puVar9 + -1;
      piVar1 = (int *)(puVar9 + -1);
      puVar9 = end;
    } while (iVar6 <= *piVar1);
  }
  while (puVar10 < end) {
    uVar4 = *puVar10;
    *puVar10 = *end;
    *end = uVar4;
    puVar11 = puVar10;
    do {
      puVar10 = puVar11 + 1;
      piVar1 = (int *)(puVar11 + 1);
      puVar11 = puVar10;
      puVar12 = end;
    } while (*piVar1 < iVar6);
    do {
      end = puVar12 + -1;
      piVar1 = (int *)(puVar12 + -1);
      puVar12 = end;
    } while (iVar6 <= *piVar1);
  }
  pVar13._9_7_ = (undefined7)((ulong)puVar9 >> 8);
  pVar13.second = puVar9 <= puVar2;
  *begin = puVar10[-1];
  puVar10[-1] = uVar3;
  pVar13.first._M_current = (SolutionEntry *)(puVar10 + -1);
  return pVar13;
}

Assistant:

inline std::pair<Iter, bool> partition_right(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        
        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));

        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        
        // Keep swapping pairs of elements that are on the wrong side of the pivot. Previously
        // swapped pairs guard the searches, which is why the first iteration is special-cased
        // above.
        while (first < last) {
            std::iter_swap(first, last);
            while (comp(*++first, pivot));
            while (!comp(*--last, pivot));
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }